

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O2

void __thiscall FIX::SocketInitiator::doConnect(SocketInitiator *this,SessionID *s,Dictionary *d)

{
  bool bVar1;
  int iVar2;
  Session *pSVar3;
  SocketConnection *this_00;
  mapped_type *ppSVar4;
  int value;
  int value_00;
  int value_01;
  Log *pLVar5;
  socket_handle result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  HostDetails host;
  
  pSVar3 = Session::lookupSession(s);
  UtcTimeStamp::now();
  bVar1 = TimeRange::isInRange(&pSVar3->m_sessionTime,(UtcTimeStamp *)&host);
  if (bVar1) {
    HostDetailsProvider::getHost(&host,&this->m_hostDetailsProvider,s,d);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"ReconnectInterval",(allocator<char> *)&local_1d8);
    bVar1 = Dictionary::has(d,(string *)&result);
    std::__cxx11::string::~string((string *)&result);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"ReconnectInterval",(allocator<char> *)&local_1d8);
      iVar2 = Dictionary::getInt(d,(string *)&result);
      this->m_reconnectInterval = iVar2;
      std::__cxx11::string::~string((string *)&result);
    }
    std::operator+(&local_158,"Connecting to ",&host.address);
    std::operator+(&local_138,&local_158," on port ");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_178,(IntTConvertor<int> *)(ulong)(ushort)host.port,value);
    std::operator+(&local_118,&local_138,&local_178);
    std::operator+(&local_f8,&local_118," (Source ");
    std::operator+(&local_d8,&local_f8,&host.sourceAddress);
    std::operator+(&local_b8,&local_d8,":");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_198,(IntTConvertor<int> *)(ulong)(ushort)host.sourcePort,value_00);
    std::operator+(&local_98,&local_b8,&local_198);
    std::operator+(&local_1d8,&local_98,") ReconnectInterval=");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_1b8,(IntTConvertor<int> *)(ulong)(uint)this->m_reconnectInterval,value_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_1d8,&local_1b8);
    pLVar5 = &(pSVar3->m_state).super_Log;
    (*pLVar5->_vptr_Log[6])(pLVar5,&result);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    iVar2 = SocketConnector::connect
                      (&this->m_connector,(int)&host,(sockaddr *)(ulong)(uint)(int)host.port,
                       (uint)this->m_noDelay);
    result = iVar2;
    Initiator::setPending(&this->super_Initiator,s);
    this_00 = (SocketConnection *)operator_new(0x2100);
    SocketConnection::SocketConnection(this_00,this,s,iVar2,&(this->m_connector).m_monitor);
    ppSVar4 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_pendingConnections,&result);
    *ppSVar4 = this_00;
    HostDetails::~HostDetails(&host);
  }
  return;
}

Assistant:

void SocketInitiator::doConnect(const SessionID &s, const Dictionary &d) {
  try {

    Session *session = Session::lookupSession(s);
    if (!session->isSessionTime(UtcTimeStamp::now())) {
      return;
    }

    Log *log = session->getLog();

    HostDetails host = m_hostDetailsProvider.getHost(s, d);
    if (d.has(RECONNECT_INTERVAL)) // ReconnectInterval in [SESSION]
    {
      m_reconnectInterval = d.getInt(RECONNECT_INTERVAL);
    }

    log->onEvent(
        "Connecting to " + host.address + " on port " + IntConvertor::convert((unsigned short)host.port) + " (Source "
        + host.sourceAddress + ":" + IntConvertor::convert((unsigned short)host.sourcePort)
        + ") ReconnectInterval=" + IntConvertor::convert((int)m_reconnectInterval));
    socket_handle result = m_connector.connect(
        host.address,
        host.port,
        m_noDelay,
        m_sendBufSize,
        m_rcvBufSize,
        host.sourceAddress,
        host.sourcePort);
    setPending(s);

    m_pendingConnections[result] = new SocketConnection(*this, s, result, &m_connector.getMonitor());
  } catch (std::exception &) {}
}